

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_raster.cpp
# Opt level: O0

void gray_hline(gray_PWorker worker,TCoord x,TCoord y,TPos area,TCoord acount)

{
  int iVar1;
  long lVar2;
  int iVar3;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  int count;
  SW_FT_Span *span;
  int coverage;
  undefined2 *local_38;
  uint local_2c;
  long local_18;
  long local_10;
  
  local_2c = (uint)(in_RCX >> 9);
  if ((int)local_2c < 0) {
    local_2c = -local_2c;
  }
  if ((*(uint *)(in_RDI + 0x738) & 2) == 0) {
    if (0xff < (int)local_2c) {
      local_2c = 0xff;
    }
  }
  else {
    local_2c = local_2c & 0x1ff;
    if (local_2c < 0x101) {
      if (local_2c == 0x100) {
        local_2c = 0xff;
      }
    }
    else {
      local_2c = 0x200 - local_2c;
    }
  }
  local_18 = *(long *)(in_RDI + 0x20) + in_RDX;
  local_10 = *(long *)(in_RDI + 0x10) + in_RSI;
  if (0x7ffe < local_10) {
    local_10 = 0x7fff;
  }
  if (0x7ffffffe < local_18) {
    local_18 = 0x7fffffff;
  }
  if (local_2c != 0) {
    iVar3 = (int)local_10;
    if (local_10 < *(int *)(in_RDI + 0x760)) {
      *(int *)(in_RDI + 0x760) = iVar3;
    }
    if (local_18 < *(int *)(in_RDI + 0x764)) {
      *(int *)(in_RDI + 0x764) = (int)local_18;
    }
    if (*(int *)(in_RDI + 0x76c) < local_18) {
      *(int *)(in_RDI + 0x76c) = (int)local_18;
    }
    if ((long)*(int *)(in_RDI + 0x768) < local_10 + in_R8) {
      *(int *)(in_RDI + 0x768) = iVar3 + (int)in_R8;
    }
    iVar1 = *(int *)(in_RDI + 0xf70);
    lVar2 = in_RDI + (long)iVar1 * 8;
    if ((((iVar1 < 1) || (*(short *)(lVar2 + 0x76a) != local_18)) ||
        ((int)*(short *)(lVar2 + 0x768) + (uint)*(ushort *)(lVar2 + 0x76c) != iVar3)) ||
       (*(byte *)(lVar2 + 0x76e) != local_2c)) {
      if (iVar1 < 0x100) {
        local_38 = (undefined2 *)(lVar2 + 0x770);
      }
      else {
        if ((*(long *)(in_RDI + 0xf78) != 0) && (0 < iVar1)) {
          (**(code **)(in_RDI + 0xf78))(iVar1,in_RDI + 0x770,*(undefined8 *)(in_RDI + 0xf80));
        }
        *(undefined4 *)(in_RDI + 0xf70) = 0;
        local_38 = (undefined2 *)(in_RDI + 0x770);
      }
      *local_38 = (short)local_10;
      local_38[1] = (short)local_18;
      local_38[2] = (short)in_R8;
      *(char *)(local_38 + 3) = (char)local_2c;
      *(int *)(in_RDI + 0xf70) = *(int *)(in_RDI + 0xf70) + 1;
    }
    else {
      *(short *)(lVar2 + 0x76c) = *(short *)(lVar2 + 0x76c) + (short)in_R8;
    }
  }
  return;
}

Assistant:

static void gray_hline(RAS_ARG_ TCoord x, TCoord y, TPos area, TCoord acount)
{
    int coverage;

    /* compute the coverage line's coverage, depending on the    */
    /* outline fill rule                                         */
    /*                                                           */
    /* the coverage percentage is area/(PIXEL_BITS*PIXEL_BITS*2) */
    /*                                                           */
    coverage = (int)(area >> (PIXEL_BITS * 2 + 1 - 8));
    /* use range 0..256 */
    if (coverage < 0) coverage = -coverage;

    if (ras.outline.flags & SW_FT_OUTLINE_EVEN_ODD_FILL) {
        coverage &= 511;

        if (coverage > 256)
            coverage = 512 - coverage;
        else if (coverage == 256)
            coverage = 255;
    } else {
        /* normal non-zero winding rule */
        if (coverage >= 256) coverage = 255;
    }

    y += (TCoord)ras.min_ey;
    x += (TCoord)ras.min_ex;

    /* SW_FT_Span.x is a 16-bit short, so limit our coordinates appropriately */
    if (x >= 32767) x = 32767;

    /* SW_FT_Span.y is an integer, so limit our coordinates appropriately */
    if (y >= SW_FT_INT_MAX) y = SW_FT_INT_MAX;

    if (coverage) {
        SW_FT_Span* span;
        int         count;

        // update bounding box.
        if (x < ras.bound_left) ras.bound_left = x;
        if (y < ras.bound_top) ras.bound_top = y;
        if (y > ras.bound_bottom) ras.bound_bottom = y;
        if (x + acount > ras.bound_right) ras.bound_right = x + acount;

        /* see whether we can add this span to the current list */
        count = ras.num_gray_spans;
        span = ras.gray_spans + count - 1;
        if (count > 0 && span->y == y && (int)span->x + span->len == (int)x &&
            span->coverage == coverage) {
            span->len = (unsigned short)(span->len + acount);
            return;
        }

        if (count >= SW_FT_MAX_GRAY_SPANS) {
            if (ras.render_span && count > 0)
                ras.render_span(count, ras.gray_spans, ras.render_span_data);

#ifdef DEBUG_GRAYS

            if (1) {
                int n;

                fprintf(stderr, "count = %3d ", count);
                span = ras.gray_spans;
                for (n = 0; n < count; n++, span++)
                    fprintf(stderr, "[%d , %d..%d] : %d ", span->y, span->x,
                            span->x + span->len - 1, span->coverage);
                fprintf(stderr, "\n");
            }

#endif /* DEBUG_GRAYS */

            ras.num_gray_spans = 0;

            span = ras.gray_spans;
        } else
            span++;

        /* add a gray span to the current list */
        span->x = (short)x;
        span->y = (short)y;
        span->len = (unsigned short)acount;
        span->coverage = (unsigned char)coverage;

        ras.num_gray_spans++;
    }
}